

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O1

int __thiscall ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  
  iVar4 = this->channels;
  if (0 < (long)iVar4) {
    uVar9 = bottom_top_blob->h * bottom_top_blob->w;
    pvVar10 = bottom_top_blob->data;
    sVar5 = bottom_top_blob->cstep;
    pvVar6 = (this->gamma_data).data;
    pvVar7 = (this->beta_data).data;
    sVar8 = bottom_top_blob->elemsize;
    lVar12 = 0;
    do {
      if ((int)uVar9 < 1) {
        fVar14 = 0.0;
        fVar13 = 0.0;
      }
      else {
        fVar13 = 0.0;
        uVar11 = 0;
        fVar14 = 0.0;
        do {
          fVar1 = *(float *)((long)pvVar10 + uVar11 * 4);
          fVar13 = fVar13 + fVar1;
          fVar14 = fVar14 + fVar1 * fVar1;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      if (0 < (int)uVar9) {
        fVar13 = fVar13 * (1.0 / (float)(int)uVar9);
        fVar1 = *(float *)((long)pvVar6 + lVar12 * 4);
        fVar2 = this->eps;
        fVar3 = *(float *)((long)pvVar7 + lVar12 * 4);
        uVar11 = 0;
        do {
          *(float *)((long)pvVar10 + uVar11 * 4) =
               (*(float *)((long)pvVar10 + uVar11 * 4) - fVar13) * fVar1 *
               (1.0 / (SQRT(fVar14 * (1.0 / (float)(int)uVar9) - fVar13 * fVar13) + fVar2)) + fVar3;
          uVar11 = uVar11 + 1;
        } while (uVar9 != uVar11);
      }
      lVar12 = lVar12 + 1;
      pvVar10 = (void *)((long)pvVar10 + sVar5 * sVar8);
    } while (lVar12 != iVar4);
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = gamma / (sqrt(var) + eps);
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}